

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall xLearn::Solver::Initialize(Solver *this,HyperParam *hyper_param)

{
  HyperParam *in_RSI;
  HyperParam *in_RDI;
  HyperParam *in_stack_00000028;
  Solver *in_stack_00000030;
  Solver *in_stack_00000050;
  Solver *in_stack_00000080;
  Solver *in_stack_00000690;
  Solver *in_stack_00000a80;
  
  print_logo(in_stack_00000050);
  checker(in_stack_00000030,in_stack_00000028);
  HyperParam::operator=(in_RSI,in_RDI);
  init_log(in_stack_00000080);
  if ((in_RDI->is_train & 1U) == 0) {
    init_predict(in_stack_00000690);
  }
  else {
    init_train(in_stack_00000a80);
  }
  return;
}

Assistant:

void Solver::Initialize(HyperParam& hyper_param) {
  // Print logo
  print_logo();
  // Check the arguments
  checker(hyper_param);
  this->hyper_param_ = hyper_param;
  // Initialize log file
  init_log();
  // Init train or predict
  if (hyper_param_.is_train) {
    init_train();
  } else {
    init_predict();
  }
}